

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O0

uint8_t * __thiscall arangodb::velocypack::ArrayIterator::first(ArrayIterator *this)

{
  uint8_t uVar1;
  ValueLength VVar2;
  uint8_t *puVar3;
  long in_RDI;
  uint8_t head;
  undefined8 in_stack_ffffffffffffffd0;
  uint8_t head_00;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffffd8;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *local_8;
  
  head_00 = (uint8_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38);
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_8 = (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x0;
  }
  else {
    uVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::head
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       0x11a82a);
    if (uVar1 == '\x13') {
      local_8 = (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::start
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           0x11a842);
      VVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
              getStartOffsetFromCompact(local_8);
      local_8 = local_8 + VVar2;
    }
    else {
      puVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::begin
                         ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                          0x11a876);
      VVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::findDataOffset
                        (in_stack_ffffffffffffffd8,head_00);
      local_8 = (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                (puVar3 + VVar2);
    }
  }
  return (uint8_t *)local_8;
}

Assistant:

[[nodiscard]] uint8_t const* first() const noexcept {
    if (VELOCYPACK_UNLIKELY(_size == 0)) {
      return nullptr;
    }
    auto const head = _slice.head();
    VELOCYPACK_ASSERT(head != 0x01);  // no empty array allowed here
    if (head == 0x13) {
      return _slice.start() + _slice.getStartOffsetFromCompact();
    }
    return _slice.begin() + _slice.findDataOffset(head);
  }